

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O2

int readFromSSDPSocket(SOCKET socket)

{
  size_t *psVar1;
  undefined8 uVar2;
  int iVar3;
  http_parser_t *parser;
  ssize_t sVar4;
  long lVar5;
  char *__cp;
  sockaddr_storage *psVar6;
  http_parser_t *phVar7;
  char *__buf;
  membuffer *m;
  byte bVar8;
  socklen_t socklen;
  char local_ad8 [48];
  ThreadPoolJob job;
  sockaddr_storage __ss;
  char staticBuf [2500];
  
  bVar8 = 0;
  socklen = 0x80;
  job.func = (start_routine)0x0;
  job.arg = (void *)0x0;
  job.free_func = (free_routine)0x0;
  job.requestTime.tv_sec = 0;
  job.requestTime.tv_usec = 0;
  job.priority = LOW_PRIORITY;
  job.jobId = 0;
  parser = (http_parser_t *)malloc(0x270);
  __buf = staticBuf;
  if (parser == (http_parser_t *)0x0) {
LAB_0011d0cb:
    parser = (http_parser_t *)0x0;
  }
  else {
    if ((gSsdpReqSocket4 == socket) || (gSsdpReqSocket6 == socket)) {
      parser_response_init(parser,HTTPMETHOD_MSEARCH);
    }
    else {
      parser_request_init(parser);
    }
    m = &(parser->msg).msg;
    iVar3 = membuffer_set_size(m,0x9c4);
    if (iVar3 != 0) {
      free(parser);
      goto LAB_0011d0cb;
    }
    __buf = m->buf;
  }
  sVar4 = recvfrom(socket,__buf,0x9c3,0,(sockaddr *)&__ss,&socklen);
  if (sVar4 < 1) {
    free_ssdp_event_handler_data(parser);
    return -1;
  }
  __buf[sVar4] = '\0';
  if (__ss.ss_family == 10) {
    __cp = __ss.__ss_padding + 6;
    iVar3 = 10;
  }
  else {
    if (__ss.ss_family != 2) {
      local_ad8[0x2d] = 0;
      builtin_strncpy(local_ad8,"<Invalid address family>",0x19);
      local_ad8[0x19] = '\0';
      local_ad8[0x1a] = '\0';
      local_ad8[0x1b] = '\0';
      local_ad8[0x1c] = '\0';
      local_ad8[0x1d] = '\0';
      local_ad8[0x1e] = '\0';
      local_ad8[0x1f] = '\0';
      local_ad8[0x20] = '\0';
      local_ad8[0x21] = '\0';
      local_ad8[0x22] = '\0';
      local_ad8[0x23] = '\0';
      local_ad8[0x24] = '\0';
      local_ad8[0x25] = '\0';
      local_ad8[0x26] = '\0';
      local_ad8[0x27] = '\0';
      local_ad8[0x28] = '\0';
      local_ad8[0x29] = '\0';
      local_ad8[0x2a] = '\0';
      local_ad8[0x2b] = '\0';
      local_ad8[0x2c] = '\0';
      goto LAB_0011d163;
    }
    __cp = __ss.__ss_padding + 2;
    iVar3 = 2;
  }
  inet_ntop(iVar3,__cp,local_ad8,0x2e);
LAB_0011d163:
  UpnpPrintf(UPNP_INFO,SSDP,".upnp/src/ssdp/ssdp_server.c",0x36e,
             "Start of received response ----------------------------------------------------\n%s\nEnd of received response ------------------------------------------------------\nFrom host %s\n"
             ,__buf,local_ad8);
  if (parser != (http_parser_t *)0x0) {
    psVar1 = &(parser->msg).msg.length;
    *psVar1 = *psVar1 + sVar4;
    (parser->msg).msg.buf[sVar4] = '\0';
    psVar6 = &__ss;
    phVar7 = parser + 1;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      uVar2._0_2_ = psVar6->ss_family;
      uVar2._2_1_ = psVar6->__ss_padding[0];
      uVar2._3_1_ = psVar6->__ss_padding[1];
      uVar2._4_1_ = psVar6->__ss_padding[2];
      uVar2._5_1_ = psVar6->__ss_padding[3];
      uVar2._6_1_ = psVar6->__ss_padding[4];
      uVar2._7_1_ = psVar6->__ss_padding[5];
      (phVar7->msg).initialized = (int)uVar2;
      (phVar7->msg).method = (int)((ulong)uVar2 >> 0x20);
      psVar6 = (sockaddr_storage *)((long)psVar6 + (ulong)bVar8 * -0x10 + 8);
      phVar7 = (http_parser_t *)((long)phVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    TPJobInit(&job,ssdp_event_handler_thread,parser);
    TPJobSetFreeFunction(&job,free_ssdp_event_handler_data);
    TPJobSetPriority(&job,MED_PRIORITY);
    iVar3 = ThreadPoolAdd(&gRecvThreadPool,&job,(int *)0x0);
    if (iVar3 != 0) {
      free_ssdp_event_handler_data(parser);
    }
  }
  return 0;
}

Assistant:

int readFromSSDPSocket(SOCKET socket)
{
	char *requestBuf = NULL;
	char staticBuf[BUFSIZE];
	struct sockaddr_storage __ss;
	ThreadPoolJob job;
	ssdp_thread_data *data = NULL;
	socklen_t socklen = sizeof(__ss);
	ssize_t byteReceived = 0;
	char ntop_buf[INET6_ADDRSTRLEN];

	memset(&job, 0, sizeof(job));

	requestBuf = staticBuf;
	/* in case memory can't be allocated, still drain the socket using a
	 * static buffer. */
	data = malloc(sizeof(ssdp_thread_data));
	if (data) {
		/* initialize parser */
	#ifdef INCLUDE_CLIENT_APIS
		if (socket == gSsdpReqSocket4
		#ifdef UPNP_ENABLE_IPV6
			|| socket == gSsdpReqSocket6
		#endif /* UPNP_ENABLE_IPV6 */
		)
			parser_response_init(&data->parser, HTTPMETHOD_MSEARCH);
		else
			parser_request_init(&data->parser);
	#else  /* INCLUDE_CLIENT_APIS */
		parser_request_init(&data->parser);
	#endif /* INCLUDE_CLIENT_APIS */
		/* set size of parser buffer */
		if (membuffer_set_size(&data->parser.msg.msg, BUFSIZE) == 0)
			/* use this as the buffer for recv */
			requestBuf = data->parser.msg.msg.buf;
		else {
			free(data);
			data = NULL;
		}
	}
	byteReceived = recvfrom(socket,
		requestBuf,
		BUFSIZE - (size_t)1,
		0,
		(struct sockaddr *)&__ss,
		&socklen);
	if (byteReceived > 0) {
		requestBuf[byteReceived] = '\0';
		switch (__ss.ss_family) {
		case AF_INET:
			inet_ntop(AF_INET,
				&((struct sockaddr_in *)&__ss)->sin_addr,
				ntop_buf,
				sizeof(ntop_buf));
			break;
	#ifdef UPNP_ENABLE_IPV6
		case AF_INET6:
			inet_ntop(AF_INET6,
				&((struct sockaddr_in6 *)&__ss)->sin6_addr,
				ntop_buf,
				sizeof(ntop_buf));
			break;
	#endif /* UPNP_ENABLE_IPV6 */
		default:
			memset(ntop_buf, 0, sizeof(ntop_buf));
			strncpy(ntop_buf,
				"<Invalid address family>",
				sizeof(ntop_buf) - 1);
		}
		/* clang-format off */
		UpnpPrintf(UPNP_INFO, SSDP, __FILE__, __LINE__,
			   "Start of received response ----------------------------------------------------\n"
			   "%s\n"
			   "End of received response ------------------------------------------------------\n"
			   "From host %s\n", requestBuf, ntop_buf);
		/* clang-format on */
		/* add thread pool job to handle request */
		if (data != NULL) {
			data->parser.msg.msg.length += (size_t)byteReceived;
			/* null-terminate */
			data->parser.msg.msg.buf[byteReceived] = 0;
			memcpy(&data->dest_addr, &__ss, sizeof(__ss));
			TPJobInit(&job,
				(start_routine)ssdp_event_handler_thread,
				data);
			TPJobSetFreeFunction(
				&job, free_ssdp_event_handler_data);
			TPJobSetPriority(&job, MED_PRIORITY);
			if (ThreadPoolAdd(&gRecvThreadPool, &job, NULL) != 0)
				free_ssdp_event_handler_data(data);
		}
		return 0;
	} else {
		free_ssdp_event_handler_data(data);
		return -1;
	}
}